

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentsObject.cpp
# Opt level: O0

PropertyQueryFlags __thiscall
Js::HeapArgumentsObject::HasPropertyQuery
          (HeapArgumentsObject *this,PropertyId id,PropertyValueInfo *info)

{
  uint uVar1;
  BOOL BVar2;
  uint32 uVar3;
  PropertyQueryFlags PVar4;
  uint local_34;
  ScriptContext *pSStack_30;
  uint32 index;
  ScriptContext *scriptContext;
  PropertyValueInfo *info_local;
  HeapArgumentsObject *pHStack_18;
  PropertyId id_local;
  HeapArgumentsObject *this_local;
  
  scriptContext = (ScriptContext *)info;
  info_local._4_4_ = id;
  pHStack_18 = this;
  pSStack_30 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
  BVar2 = ScriptContext::IsNumericPropertyId(pSStack_30,info_local._4_4_,&local_34);
  uVar1 = local_34;
  if ((BVar2 != 0) && (uVar3 = GetNumberOfArguments(this), uVar1 < uVar3)) {
    PVar4 = HasItemQuery(this,local_34);
    return PVar4;
  }
  PVar4 = DynamicObject::HasPropertyQuery
                    ((DynamicObject *)this,info_local._4_4_,(PropertyValueInfo *)scriptContext);
  return PVar4;
}

Assistant:

PropertyQueryFlags HeapArgumentsObject::HasPropertyQuery(PropertyId id, _Inout_opt_ PropertyValueInfo* info)
    {
        ScriptContext *scriptContext = GetScriptContext();

        // Try to get a numbered property that maps to an actual argument.
        uint32 index;
        if (scriptContext->IsNumericPropertyId(id, &index) && index < this->HeapArgumentsObject::GetNumberOfArguments())
        {
            return HeapArgumentsObject::HasItemQuery(index);
        }

        return DynamicObject::HasPropertyQuery(id, info);
    }